

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafeTest_StopImmediatelyAfterStarting_Test::
~CommissionerSafeTest_StopImmediatelyAfterStarting_Test
          (CommissionerSafeTest_StopImmediatelyAfterStarting_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CommissionerSafeTest, StopImmediatelyAfterStarting)
{
    CommissionerHandler dummyHandler;

    Config config;
    config.mEnableCcm = false;
    config.mPSKc = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    // This creates an CommissionerSafe instance.
    auto commissioner = Commissioner::Create(dummyHandler);
    EXPECT_NE(commissioner, nullptr);
    EXPECT_EQ(commissioner->Init(config), ErrorCode::kNone);
}